

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O3

bool pbrt::ParseArg<float*>
               (char ***argv,string *name,float *out,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *onError)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char **ppcVar3;
  char *__s;
  bool bVar4;
  int iVar5;
  undefined1 *puVar6;
  bool bVar7;
  string value;
  string arg;
  __string_type __str;
  string ret;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  _Any_data *local_b8;
  anon_unknown_4 *local_b0;
  string *local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  local_b8 = (_Any_data *)onError;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,**argv,(allocator<char> *)&local_f8);
  if (local_d8._M_dataplus._M_p[1] == '-') {
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
  }
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  anon_unknown_4::normalizeArg
            (&local_f8,(anon_unknown_4 *)local_d8._M_dataplus._M_p,
             (string *)local_d8._M_string_length);
  pcVar2 = (name->_M_dataplus)._M_p;
  local_b0 = (anon_unknown_4 *)local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_b0,(ulong)local_a8,0,'\x01');
  anon_unknown_4::normalizeArg(&local_90,local_b0,local_a8);
  if (local_f8._M_string_length < local_90._M_string_length) {
    bVar4 = false;
  }
  else if ((string *)local_90._M_string_length == (string *)0x0) {
    bVar4 = true;
  }
  else {
    puVar6 = (undefined1 *)0x0;
    do {
      bVar4 = local_90._M_dataplus._M_p[(long)puVar6] == local_f8._M_dataplus._M_p[(long)puVar6];
      if (!bVar4) break;
      bVar7 = (undefined1 *)((long)&((string *)(local_90._M_string_length + -0x20))->field_2 + 0xf)
              != puVar6;
      puVar6 = puVar6 + 1;
    } while (bVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != (anon_unknown_4 *)local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  paVar1 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    *argv = *argv + 1;
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
    bVar4 = anon_unknown_4::initArg
                      ((anon_unknown_4 *)local_f8._M_dataplus._M_p,
                       (string *)local_f8._M_string_length,out);
    if (!bVar4) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string_const&>
                (&local_50,"invalid value \"%s\" for %s argument",&local_f8,name);
      if (*(long *)(local_b8 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(local_b8->_M_pod_data + 0x18))(local_b8,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    anon_unknown_4::normalizeArg
              (&local_f8,(anon_unknown_4 *)local_d8._M_dataplus._M_p,
               (string *)local_d8._M_string_length);
    anon_unknown_4::normalizeArg
              (&local_90,(anon_unknown_4 *)(name->_M_dataplus)._M_p,(string *)name->_M_string_length
              );
    if (local_f8._M_string_length == local_90._M_string_length) {
      if ((string *)local_f8._M_string_length == (string *)0x0) {
        bVar4 = true;
      }
      else {
        iVar5 = bcmp(local_f8._M_dataplus._M_p,local_90._M_dataplus._M_p,local_f8._M_string_length);
        bVar4 = iVar5 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      ppcVar3 = *argv;
      *argv = ppcVar3 + 1;
      __s = ppcVar3[1];
      if (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,__s,(allocator<char> *)&local_90);
        anon_unknown_4::initArg
                  ((anon_unknown_4 *)local_f8._M_dataplus._M_p,(string *)local_f8._M_string_length,
                   out);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        *argv = *argv + 1;
        bVar4 = true;
        goto LAB_0024a7a0;
      }
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_70,"missing value after %s argument",&local_d8);
      if (*(long *)(local_b8 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(local_b8->_M_pod_data + 0x18))(local_b8,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
    }
    bVar4 = false;
  }
LAB_0024a7a0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}